

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O1

int HRSS_encap(uint8_t *out_ciphertext,uint8_t *out_shared_key,HRSS_public_key *in_pub,uint8_t *in)

{
  POLY_MUL_SCRATCH *out;
  poly *out_00;
  vec_t *r;
  uint i;
  POLY_MUL_SCRATCH *scratch;
  long lVar1;
  int iVar2;
  SHA256_CTX *c;
  void *malloc_ptr;
  void *local_38;
  
  if (((ulong)(in_pub->opaque + (-(int)in_pub & 0xf)) & 0xf) == 0) {
    scratch = (POLY_MUL_SCRATCH *)malloc_align32(&local_38,0x9e70);
    if (scratch == (POLY_MUL_SCRATCH *)0x0) {
      iVar2 = 0;
      memset(out_ciphertext,0,0x472);
      RAND_bytes(out_shared_key,0x20);
    }
    else {
      memset(scratch,0xff,0x9e70);
      out = scratch + 1;
      poly_short_sample((poly *)out,in);
      out_00 = (poly *)((long)&scratch[1].u + 0x580);
      poly_short_sample(out_00,in + 700);
      poly_lift((poly *)((long)&scratch[1].u + 0xb00),(poly *)out);
      r = scratch[1].u.vec.scratch + 0x58;
      poly_mul(scratch,(poly *)r,out_00,(poly *)(in_pub->opaque + (-(int)in_pub & 0xf)));
      lVar1 = 0;
      do {
        ((anon_union_1408_2_d74be4fb_for_poly_0 *)*r)->v[lVar1] =
             ((anon_union_1408_2_d74be4fb_for_poly_0 *)*r)->v[lVar1] +
             *(short *)((long)&scratch[1].u + lVar1 * 2 + 0xb00);
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0x2bd);
      poly_marshal(out_ciphertext,(poly *)r);
      poly_marshal_mod3(scratch[1].u.rq + 0x1670,(poly *)out);
      poly_marshal_mod3(scratch[1].u.rq + 0x16fc,out_00);
      c = (SHA256_CTX *)((&scratch[1].u.novec)[1].prod + 0x60);
      SHA256_Init(c);
      SHA256_Update(c,"shared key",0xb);
      SHA256_Update(c,scratch[1].u.rq + 0x1670,0x8c);
      SHA256_Update(c,scratch[1].u.rq + 0x16fc,0x8c);
      SHA256_Update(c,out_ciphertext,0x472);
      SHA256_Final(out_shared_key,c);
      OPENSSL_free(local_38);
      iVar2 = 1;
    }
    return iVar2;
  }
  __assert_fail("((uintptr_t)ptr & (alignment - 1)) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/../internal.h"
                ,0xc0,"void *align_pointer(void *, size_t)");
}

Assistant:

int HRSS_encap(uint8_t out_ciphertext[POLY_BYTES], uint8_t out_shared_key[32],
               const struct HRSS_public_key *in_pub,
               const uint8_t in[HRSS_SAMPLE_BYTES + HRSS_SAMPLE_BYTES]) {
  const struct public_key *pub =
      public_key_from_external((struct HRSS_public_key *)in_pub);

  struct vars {
    struct POLY_MUL_SCRATCH scratch;
    struct poly m, r, m_lifted;
    struct poly prh_plus_m;
    SHA256_CTX hash_ctx;
    uint8_t m_bytes[HRSS_POLY3_BYTES];
    uint8_t r_bytes[HRSS_POLY3_BYTES];
  };

  void *malloc_ptr;
  struct vars *const vars = reinterpret_cast<struct vars *>(
      malloc_align32(&malloc_ptr, sizeof(struct vars)));
  if (!vars) {
    // If the caller ignores the return value the output will still be safe.
    // The private key output is randomised in case it's used to encrypt and
    // transmit something.
    memset(out_ciphertext, 0, POLY_BYTES);
    RAND_bytes(out_shared_key, 32);
    return 0;
  }

#if !defined(NDEBUG)
  OPENSSL_memset(vars, 0xff, sizeof(struct vars));
#endif

  poly_short_sample(&vars->m, in);
  poly_short_sample(&vars->r, in + HRSS_SAMPLE_BYTES);
  poly_lift(&vars->m_lifted, &vars->m);

  poly_mul(&vars->scratch, &vars->prh_plus_m, &vars->r, &pub->ph);
  for (unsigned i = 0; i < N; i++) {
    vars->prh_plus_m.v[i] += vars->m_lifted.v[i];
  }

  poly_marshal(out_ciphertext, &vars->prh_plus_m);

  poly_marshal_mod3(vars->m_bytes, &vars->m);
  poly_marshal_mod3(vars->r_bytes, &vars->r);

  SHA256_Init(&vars->hash_ctx);
  SHA256_Update(&vars->hash_ctx, kSharedKey, sizeof(kSharedKey));
  SHA256_Update(&vars->hash_ctx, vars->m_bytes, sizeof(vars->m_bytes));
  SHA256_Update(&vars->hash_ctx, vars->r_bytes, sizeof(vars->r_bytes));
  SHA256_Update(&vars->hash_ctx, out_ciphertext, POLY_BYTES);
  SHA256_Final(out_shared_key, &vars->hash_ctx);

  OPENSSL_free(malloc_ptr);
  return 1;
}